

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O0

LY_ERR lyd_find_sibling_opaq_next(lyd_node *first,char *name,lyd_node **match)

{
  int iVar1;
  char *local_30;
  lyd_node **match_local;
  char *name_local;
  lyd_node *first_local;
  
  if (name == (char *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","name",
           "lyd_find_sibling_opaq_next");
    first_local._4_4_ = LY_EINVAL;
  }
  else {
    name_local = (char *)first;
    if ((first != (lyd_node *)0x0) && (first->schema != (lysc_node *)0x0)) {
      name_local = (char *)first->prev;
      if (((lyd_node *)name_local)->schema == (lysc_node *)0x0) {
        while (*(long *)(*(long *)(name_local + 0x20) + 8) == 0) {
          name_local = *(char **)(name_local + 0x20);
        }
      }
      else {
        name_local = (char *)0x0;
      }
    }
    for (; name_local != (char *)0x0; name_local = *(char **)(name_local + 0x18)) {
      if (*(long *)(name_local + 8) != 0) {
        __assert_fail("!first->schema",
                      "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/tree_data.c"
                      ,0xcce,
                      "LY_ERR lyd_find_sibling_opaq_next(const struct lyd_node *, const char *, struct lyd_node **)"
                     );
      }
      if (*(long *)(name_local + 8) == 0) {
        local_30 = *(char **)(name_local + 0x40);
      }
      else {
        local_30 = *(char **)(*(long *)(name_local + 8) + 0x28);
      }
      iVar1 = strcmp(local_30,name);
      if (iVar1 == 0) break;
    }
    if (match != (lyd_node **)0x0) {
      *match = (lyd_node *)name_local;
    }
    first_local._4_4_ = LY_ENOTFOUND;
    if (name_local != (char *)0x0) {
      first_local._4_4_ = LY_SUCCESS;
    }
  }
  return first_local._4_4_;
}

Assistant:

LIBYANG_API_DEF LY_ERR
lyd_find_sibling_opaq_next(const struct lyd_node *first, const char *name, struct lyd_node **match)
{
    LY_CHECK_ARG_RET(NULL, name, LY_EINVAL);

    if (first && first->schema) {
        first = first->prev;
        if (first->schema) {
            /* no opaque nodes */
            first = NULL;
        } else {
            /* opaque nodes are at the end, find quickly the first */
            while (!first->prev->schema) {
                first = first->prev;
            }
        }
    }

    for ( ; first; first = first->next) {
        assert(!first->schema);
        if (!strcmp(LYD_NAME(first), name)) {
            break;
        }
    }

    if (match) {
        *match = (struct lyd_node *)first;
    }
    return first ? LY_SUCCESS : LY_ENOTFOUND;
}